

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aegis128l.cc
# Opt level: O2

int aead_aegis_128l_seal_scatter
              (EVP_AEAD_CTX *ctx,uint8_t *out,uint8_t *out_tag,size_t *out_tag_len,
              size_t max_out_tag_len,uint8_t *nonce,size_t nonce_len,uint8_t *in,size_t in_len,
              uint8_t *extra_in,size_t extra_in_len,uint8_t *ad,size_t ad_len)

{
  long lVar1;
  int reason;
  uint8_t *puVar2;
  int line;
  size_t __n;
  undefined1 *puVar3;
  ulong uVar4;
  ulong uVar5;
  size_t __n_00;
  long lVar6;
  undefined1 local_160 [32];
  size_t local_138;
  ulong local_130;
  size_t *local_128;
  uint8_t local_120 [32];
  longlong local_100 [26];
  
  local_130 = (ulong)ctx->tag_len;
  if (max_out_tag_len < local_130) {
    reason = 0x67;
    line = 0xdb;
LAB_002436bd:
    ERR_put_error(0x1e,0,reason,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_aegis128l.cc"
                  ,line);
    return 0;
  }
  if (0x10 < nonce_len) {
    reason = 0x79;
    line = 0xdf;
    goto LAB_002436bd;
  }
  local_128 = out_tag_len;
  aegis_128l_state_init((ctx->state).opaque,nonce,nonce_len,(aes_block_t *)local_100);
  puVar2 = local_120;
  for (uVar4 = 0x20; uVar4 <= ad_len; uVar4 = uVar4 + 0x20) {
    aead_aegis_128l_enc(puVar2,ad,(aes_block_t *)local_100);
    ad = ad + 0x20;
  }
  uVar4 = ad_len & 0x1f;
  if (uVar4 != 0) {
    memset(local_160 + uVar4,0,0x20 - uVar4);
    memcpy(local_160,ad,uVar4);
    aead_aegis_128l_enc(local_120,local_160,(aes_block_t *)local_100);
  }
  puVar3 = local_160;
  uVar4 = 0;
  while (uVar4 + 0x20 <= in_len) {
    aead_aegis_128l_enc(out + uVar4,in + uVar4,(aes_block_t *)local_100);
    puVar2 = puVar2 + -0x20;
    puVar3 = puVar3 + -0x20;
    uVar4 = uVar4 + 0x20;
  }
  local_160 = ZEXT1632(ZEXT816(0) << 0x40);
  __n_00 = in_len - uVar4;
  lVar6 = uVar4 - in_len;
  if (extra_in_len == 0) {
    if (lVar6 == 0) goto LAB_002439af;
    memcpy(local_160,in + uVar4,__n_00);
    aead_aegis_128l_enc(local_120,local_160,(aes_block_t *)local_100);
    puVar2 = out + uVar4;
  }
  else {
    uVar5 = lVar6 + 0x20;
    __n = extra_in_len;
    if (uVar5 < extra_in_len) {
      __n = uVar5;
    }
    if (lVar6 != 0) {
      memcpy(local_160,in + uVar4,__n_00);
    }
    local_138 = __n_00;
    if (in_len - 0x20 != uVar4) {
      memcpy(puVar3 + in_len,extra_in,__n);
    }
    aead_aegis_128l_enc(local_120,local_160,(aes_block_t *)local_100);
    if (lVar6 != 0) {
      memcpy(out + uVar4,local_120,local_138);
    }
    if (in_len - 0x20 != uVar4) {
      memcpy(out_tag,puVar2 + in_len,__n);
    }
    uVar4 = uVar5;
    if (extra_in_len < uVar5) {
      uVar4 = extra_in_len;
    }
    for (lVar6 = 0; uVar4 + lVar6 + 0x20 < extra_in_len; lVar6 = lVar6 + 0x20) {
      aead_aegis_128l_enc(out_tag + lVar6 + uVar4,extra_in + lVar6 + uVar4,(aes_block_t *)local_100)
      ;
    }
    lVar1 = 0;
    if (uVar5 <= extra_in_len) {
      lVar1 = extra_in_len - uVar5;
    }
    if (lVar1 == lVar6) goto LAB_002439af;
    if (extra_in_len < uVar5) {
      uVar5 = extra_in_len;
    }
    __n_00 = (extra_in_len - uVar5) - lVar6;
    local_160 = ZEXT1632(ZEXT816(0));
    memcpy(local_160,extra_in + lVar6 + uVar5,__n_00);
    aead_aegis_128l_enc(local_120,local_160,(aes_block_t *)local_100);
    puVar2 = out_tag + uVar5 + lVar6;
  }
  memcpy(puVar2,local_120,__n_00);
LAB_002439af:
  aead_aegis_128l_tag(out_tag + extra_in_len,ad_len,in_len + extra_in_len,(aes_block_t *)local_100);
  *local_128 = local_130 + extra_in_len;
  return 1;
}

Assistant:

static int aead_aegis_128l_seal_scatter(
    const EVP_AEAD_CTX *ctx, uint8_t *out, uint8_t *out_tag,
    size_t *out_tag_len, size_t max_out_tag_len, const uint8_t *nonce,
    size_t nonce_len, const uint8_t *in, size_t in_len, const uint8_t *extra_in,
    size_t extra_in_len, const uint8_t *ad, size_t ad_len) {
  const struct aead_aegis_128l_ctx *aegis_ctx =
      (struct aead_aegis_128l_ctx *)&ctx->state;

  return aegis_128l_seal_scatter(
      aegis_ctx->key, out, out_tag, out_tag_len, max_out_tag_len, nonce,
      nonce_len, in, in_len, extra_in, extra_in_len, ad, ad_len, ctx->tag_len);
}